

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Var.cpp
# Opt level: O1

void __thiscall asl::Var::operator=(Var *this,uint x)

{
  undefined4 in_register_00000034;
  
  if (this->_type != NONE) {
    free(this,(void *)CONCAT44(in_register_00000034,x));
  }
  if ((int)x < 0) {
    this->_type = NUMBER;
    (this->field_1)._d = (double)x;
  }
  else {
    this->_type = INT;
    (this->field_1)._i = x;
  }
  return;
}

Assistant:

void Var::operator=(unsigned x)
{
	if(_type == NONE){}
	else
		free();
	if (x & 0x80000000) {
		_type = NUMBER;
		_d = (double)x;
	}
	else {
		_type = INT;
		_i = (int)x;
	}
}